

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QGraphicsItem * __thiscall QGraphicsItem::clipPath(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItem *other;
  _func_int **pp_Var2;
  char cVar3;
  QGraphicsItemPrivate *pQVar4;
  ulong uVar5;
  QGraphicsItemPrivate *d;
  QGraphicsItem *in_RSI;
  QGraphicsItem *this_00;
  long in_FS_OFFSET;
  _func_int **local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (in_RSI->d_ptr).d;
  if ((*(ulong *)&pQVar1->field_0x160 & 0x800020000) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_005dee6c;
    QPainterPath::QPainterPath((QPainterPath *)this);
  }
  else {
    local_98 = 0xffffffff;
    uStack_94 = 0xffffffff;
    uStack_90 = 0xffffffff;
    uStack_8c = 0xffffffff;
    local_a8 = 0xffffffff;
    uStack_a4 = 0xffffffff;
    uStack_a0 = 0xffffffff;
    uStack_9c = 0xffffffff;
    (*in_RSI->_vptr_QGraphicsItem[3])(&local_a8);
    if (((double)CONCAT44(uStack_94,local_98) <= 0.0) ||
       ((double)CONCAT44(uStack_8c,uStack_90) <= 0.0)) {
      QPainterPath::QPainterPath((QPainterPath *)this);
    }
    else {
      this->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)this);
      QPainterPath::addRect((QRectF *)this);
      if ((pQVar1->field_0x162 & 2) != 0) {
        pQVar4 = (in_RSI->d_ptr).d;
        this_00 = in_RSI;
        do {
          other = pQVar4->parent;
          if (other == (QGraphicsItem *)0x0) break;
          pQVar4 = (other->d_ptr).d;
          uVar5 = *(ulong *)&pQVar4->field_0x160;
          if ((uVar5 >> 0x24 & 1) != 0) {
            itemTransform(&local_88,this_00,other,(bool *)0x0);
            QTransform::map((QPainterPath *)&local_b0);
            pp_Var2 = this->_vptr_QGraphicsItem;
            this->_vptr_QGraphicsItem = local_b0;
            local_b0 = pp_Var2;
            QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
            (*other->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0,other);
            QPainterPath::intersected((QPainterPath *)&local_88);
            pp_Var2 = this->_vptr_QGraphicsItem;
            this->_vptr_QGraphicsItem = (_func_int **)local_88.m_matrix[0][0];
            local_88.m_matrix[0][0] = (qreal)pp_Var2;
            QPainterPath::~QPainterPath((QPainterPath *)&local_88);
            QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
            cVar3 = QPainterPath::isEmpty();
            if (cVar3 != '\0') goto LAB_005dee44;
            pQVar4 = (other->d_ptr).d;
            uVar5 = *(ulong *)&pQVar4->field_0x160;
            this_00 = other;
          }
        } while (((uint)uVar5 >> 0x11 & 1) != 0);
        if (this_00 != in_RSI) {
          itemTransform(&local_88,this_00,in_RSI,(bool *)0x0);
          QTransform::map((QPainterPath *)&local_b0);
          pp_Var2 = this->_vptr_QGraphicsItem;
          this->_vptr_QGraphicsItem = local_b0;
          local_b0 = pp_Var2;
          QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
        }
      }
      if ((*(ulong *)&pQVar1->field_0x160 & 0x800000000) != 0) {
        (*in_RSI->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0);
        QPainterPath::intersected((QPainterPath *)&local_88);
        pp_Var2 = this->_vptr_QGraphicsItem;
        this->_vptr_QGraphicsItem = (_func_int **)local_88.m_matrix[0][0];
        local_88.m_matrix[0][0] = (qreal)pp_Var2;
        QPainterPath::~QPainterPath((QPainterPath *)&local_88);
        QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
      }
    }
LAB_005dee44:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_005dee6c:
      __stack_chk_fail();
    }
  }
  return this;
}

Assistant:

QPainterPath QGraphicsItem::clipPath() const
{
    Q_D(const QGraphicsItem);
    if (!isClipped())
        return QPainterPath();

    const QRectF thisBoundingRect(boundingRect());
    if (thisBoundingRect.isEmpty())
        return QPainterPath();

    QPainterPath clip;
    // Start with the item's bounding rect.
    clip.addRect(thisBoundingRect);

    if (d->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren) {
        const QGraphicsItem *parent = this;
        const QGraphicsItem *lastParent = this;

        // Intersect any in-between clips starting at the top and moving downwards.
        while ((parent = parent->d_ptr->parent)) {
            if (parent->d_ptr->flags & ItemClipsChildrenToShape) {
                // Map clip to the current parent and intersect with its shape/clipPath
                clip = lastParent->itemTransform(parent).map(clip);
                clip = clip.intersected(parent->shape());
                if (clip.isEmpty())
                    return clip;
                lastParent = parent;
            }

            if (!(parent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren))
                break;
        }

        if (lastParent != this) {
            // Map clip back to the item's transform.
            // ### what if itemtransform fails
            clip = lastParent->itemTransform(this).map(clip);
        }
    }

    if (d->flags & ItemClipsToShape)
        clip = clip.intersected(shape());

    return clip;
}